

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerJob.h
# Opt level: O2

void __thiscall
xmrig::WorkerJob<1UL>::nextRound(WorkerJob<1UL> *this,uint32_t rounds,uint32_t roundSize)

{
  byte index;
  uint uVar1;
  uint32_t uVar2;
  
  index = this->m_index;
  uVar1 = this->m_rounds[index] + 1;
  this->m_rounds[index] = uVar1;
  uVar2 = *(uint32_t *)(this->m_blobs[index] + 0x27);
  if (uVar1 % rounds == 0) {
    uVar2 = Nonce::next(index,uVar2,roundSize * rounds);
    *(uint32_t *)(this->m_blobs[this->m_index] + 0x27) = uVar2;
  }
  else {
    *(uint32_t *)(this->m_blobs[index] + 0x27) = uVar2 + roundSize;
  }
  return;
}

Assistant:

inline void xmrig::WorkerJob<1>::nextRound(uint32_t rounds, uint32_t roundSize)
{
    m_rounds[index()]++;

    if ((m_rounds[index()] % rounds) == 0) {
        *nonce() = Nonce::next(index(), *nonce(), rounds * roundSize);
    }
    else {
        *nonce() += roundSize;
    }
}